

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O1

laszip_I32 laszip_check_for_integer_overflow(laszip_POINTER pointer)

{
  double dVar1;
  double dVar2;
  char *__format;
  ulong uVar3;
  double dVar4;
  
  if (pointer != (laszip_POINTER)0x0) {
    dVar1 = *(double *)((long)pointer + 0x98);
    dVar2 = *(double *)((long)pointer + 0x80);
    dVar4 = (*(double *)((long)pointer + 0xb8) - dVar1) / dVar2;
    uVar3 = -(ulong)(dVar4 < 0.0);
    if (0.0 < *(double *)((long)pointer + 0xb8) ==
        (double)(int)((double)(~uVar3 & 0x3fe0000000000000 | uVar3 & 0xbfe0000000000000) + dVar4) *
        dVar2 + dVar1 <= 0.0) {
      __format = 
      "quantization sign flip for min_x from %g to %g. set scale factor for x coarser than %g\n";
    }
    else {
      dVar4 = (*(double *)((long)pointer + 0xb0) - dVar1) / dVar2;
      uVar3 = -(ulong)(dVar4 < 0.0);
      if (0.0 < *(double *)((long)pointer + 0xb0) ==
          (double)(int)((double)(~uVar3 & 0x3fe0000000000000 | uVar3 & 0xbfe0000000000000) + dVar4)
          * dVar2 + dVar1 <= 0.0) {
        __format = 
        "quantization sign flip for max_x from %g to %g. set scale factor for x coarser than %g\n";
      }
      else {
        dVar1 = *(double *)((long)pointer + 0x88);
        dVar2 = *(double *)((long)pointer + 0xa0);
        dVar4 = (*(double *)((long)pointer + 200) - dVar2) / dVar1;
        uVar3 = -(ulong)(dVar4 < 0.0);
        if ((double)(int)((double)(~uVar3 & 0x3fe0000000000000 | uVar3 & 0xbfe0000000000000) + dVar4
                         ) * dVar1 + dVar2 <= 0.0 == 0.0 < *(double *)((long)pointer + 200)) {
          __format = 
          "quantization sign flip for min_y from %g to %g. set scale factor for y coarser than %g\n"
          ;
        }
        else {
          dVar4 = (*(double *)((long)pointer + 0xc0) - dVar2) / dVar1;
          uVar3 = -(ulong)(dVar4 < 0.0);
          if (0.0 < *(double *)((long)pointer + 0xc0) ==
              (double)(int)((double)(~uVar3 & 0x3fe0000000000000 | uVar3 & 0xbfe0000000000000) +
                           dVar4) * dVar1 + dVar2 <= 0.0) {
            __format = 
            "quantization sign flip for max_y from %g to %g. set scale factor for y coarser than %g\n"
            ;
          }
          else {
            dVar1 = *(double *)((long)pointer + 0xa8);
            dVar2 = *(double *)((long)pointer + 0x90);
            dVar4 = (*(double *)((long)pointer + 0xd8) - dVar1) / dVar2;
            uVar3 = -(ulong)(dVar4 < 0.0);
            if ((double)(int)((double)(~uVar3 & 0x3fe0000000000000 | uVar3 & 0xbfe0000000000000) +
                             dVar4) * dVar2 + dVar1 <= 0.0 ==
                0.0 < *(double *)((long)pointer + 0xd8)) {
              __format = 
              "quantization sign flip for min_z from %g to %g. set scale factor for z coarser than %g\n"
              ;
            }
            else {
              dVar4 = (*(double *)((long)pointer + 0xd0) - dVar1) / dVar2;
              uVar3 = -(ulong)(dVar4 < 0.0);
              if (0.0 < *(double *)((long)pointer + 0xd0) !=
                  (double)(int)((double)(~uVar3 & 0x3fe0000000000000 | uVar3 & 0xbfe0000000000000) +
                               dVar4) * dVar2 + dVar1 <= 0.0) {
                *(undefined1 *)((long)pointer + 0x248) = 0;
                return 0;
              }
              __format = 
              "quantization sign flip for max_z from %g to %g. set scale factor for z coarser than %g\n"
              ;
            }
          }
        }
      }
    }
    snprintf((char *)((long)pointer + 0x248),0x400,__format);
  }
  return 1;
}

Assistant:

LASZIP_API laszip_I32
laszip_check_for_integer_overflow(
    laszip_POINTER                     pointer
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    // get a pointer to the header

    laszip_header_struct* header = &(laszip_dll->header);

    // quantize and dequantize the bounding box with current scale_factor and offset

    I32 quant_min_x = I32_QUANTIZE((header->min_x-header->x_offset)/header->x_scale_factor);
    I32 quant_max_x = I32_QUANTIZE((header->max_x-header->x_offset)/header->x_scale_factor);
    I32 quant_min_y = I32_QUANTIZE((header->min_y-header->y_offset)/header->y_scale_factor);
    I32 quant_max_y = I32_QUANTIZE((header->max_y-header->y_offset)/header->y_scale_factor);
    I32 quant_min_z = I32_QUANTIZE((header->min_z-header->z_offset)/header->z_scale_factor);
    I32 quant_max_z = I32_QUANTIZE((header->max_z-header->z_offset)/header->z_scale_factor);

    F64 dequant_min_x = header->x_scale_factor*quant_min_x+header->x_offset;
    F64 dequant_max_x = header->x_scale_factor*quant_max_x+header->x_offset;
    F64 dequant_min_y = header->y_scale_factor*quant_min_y+header->y_offset;
    F64 dequant_max_y = header->y_scale_factor*quant_max_y+header->y_offset;
    F64 dequant_min_z = header->z_scale_factor*quant_min_z+header->z_offset;
    F64 dequant_max_z = header->z_scale_factor*quant_max_z+header->z_offset;

    // make sure that there is not sign flip (a 32-bit integer overflow) for the bounding box

    if ((header->min_x > 0) != (dequant_min_x > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for min_x from %g to %g. set scale factor for x coarser than %g\n", header->min_x, dequant_min_x, header->x_scale_factor);
      return 1;
    }
    if ((header->max_x > 0) != (dequant_max_x > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for max_x from %g to %g. set scale factor for x coarser than %g\n", header->max_x, dequant_max_x, header->x_scale_factor);
      return 1;
    }
    if ((header->min_y > 0) != (dequant_min_y > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for min_y from %g to %g. set scale factor for y coarser than %g\n", header->min_y, dequant_min_y, header->y_scale_factor);
      return 1;
    }
    if ((header->max_y > 0) != (dequant_max_y > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for max_y from %g to %g. set scale factor for y coarser than %g\n", header->max_y, dequant_max_y, header->y_scale_factor);
      return 1;
    }
    if ((header->min_z > 0) != (dequant_min_z > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for min_z from %g to %g. set scale factor for z coarser than %g\n", header->min_z, dequant_min_z, header->z_scale_factor);
      return 1;
    }
    if ((header->max_z > 0) != (dequant_max_z > 0))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "quantization sign flip for max_z from %g to %g. set scale factor for z coarser than %g\n", header->max_z, dequant_max_z, header->z_scale_factor);
      return 1;
    }
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_auto_offset");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}